

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateChangePerfTestCases.cpp
# Opt level: O2

void __thiscall
deqp::gls::StateChangePerformanceCase::requireFramebuffers
          (StateChangePerformanceCase *this,int count)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  GLuint framebuffer;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  long lVar3;
  
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if ((int)((ulong)((long)(this->m_framebuffers).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->m_framebuffers).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2) < count) {
    local_38 = &this->m_framebuffers;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(local_38,(long)count);
    requireRenderbuffers(this,count);
    while ((int)((ulong)((long)(this->m_framebuffers).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_framebuffers).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2) < count) {
      (**(code **)(lVar3 + 0x6d0))(1,&framebuffer);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"glGenFramebuffers()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x189);
      (**(code **)(lVar3 + 0x78))(0x8d40,framebuffer);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"glBindFramebuffer()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x18c);
      (**(code **)(lVar3 + 0xa0))
                (0x8d41,*(undefined4 *)
                         ((long)(this->m_framebuffers).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                         ((long)(this->m_renderbuffers).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start -
                         (long)(this->m_framebuffers).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start)));
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"glBindRenderbuffer()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,399);
      (**(code **)(lVar3 + 0x688))
                (0x8d40,0x8ce0,0x8d41,
                 *(undefined4 *)
                  ((long)(this->m_framebuffers).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish +
                  ((long)(this->m_renderbuffers).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start -
                  (long)(this->m_framebuffers).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start)));
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"glFramebufferRenderbuffer()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x192);
      (**(code **)(lVar3 + 0xa0))(0x8d41,0);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"glBindRenderbuffer()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x195);
      (**(code **)(lVar3 + 0x78))(0x8d40,0);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"glBindFramebuffer()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x198);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(local_38,&framebuffer);
    }
  }
  return;
}

Assistant:

void StateChangePerformanceCase::requireFramebuffers (int count)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	if ((int)m_framebuffers.size() >= count)
		return;

	m_framebuffers.reserve(count);

	requireRenderbuffers(count);

	while ((int)m_framebuffers.size() < count)
	{
		GLuint framebuffer;

		gl.genFramebuffers(1, &framebuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers()");

		gl.bindFramebuffer(GL_FRAMEBUFFER, framebuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer()");

		gl.bindRenderbuffer(GL_RENDERBUFFER, m_renderbuffers[m_framebuffers.size()]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffer()");

		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_renderbuffers[m_framebuffers.size()]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer()");

		gl.bindRenderbuffer(GL_RENDERBUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffer()");

		gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer()");

		m_framebuffers.push_back(framebuffer);
	}
}